

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CopyString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pString)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  value_type local_40;
  
  __s = *a_pString;
  sVar1 = strlen(__s);
  __dest = (char *)operator_new__(sVar1 + 1);
  memcpy(__dest,__s,sVar1 + 1);
  local_40.pComment = (char *)0x0;
  local_40.nOrder = 0;
  local_40.pItem = __dest;
  std::__cxx11::
  list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ::push_back(&this->m_strings,&local_40);
  *a_pString = __dest;
  return SI_OK;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::CopyString(const SI_CHAR *&a_pString) {
	size_t uLen = 0;
	if (sizeof(SI_CHAR) == sizeof(char)) {
		uLen = strlen((const char *)a_pString);
	} else if (sizeof(SI_CHAR) == sizeof(wchar_t)) {
		uLen = wcslen((const wchar_t *)a_pString);
	} else {
		for (; a_pString[uLen]; ++uLen) /*loop*/
			;
	}
	++uLen;  // NULL character
	SI_CHAR *pCopy = new SI_CHAR[uLen];
	if (!pCopy) {
		return SI_NOMEM;
	}
	memcpy(pCopy, a_pString, sizeof(SI_CHAR) * uLen);
	m_strings.push_back(pCopy);
	a_pString = pCopy;
	return SI_OK;
}